

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void google::GetAllFlags(vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                         *OUTPUT)

{
  FlagRegistry *pFVar1;
  _Base_ptr p_Var2;
  CommandLineFlagInfo fi;
  CommandLineFlagInfo local_100;
  
  pFVar1 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  gflags_mutex_namespace::Mutex::Lock(&pFVar1->lock_);
  for (p_Var2 = (pFVar1->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pFVar1->flags_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
    local_100.name._M_string_length = 0;
    local_100.name.field_2._M_local_buf[0] = '\0';
    local_100.type._M_dataplus._M_p = (pointer)&local_100.type.field_2;
    local_100.type._M_string_length = 0;
    local_100.type.field_2._M_local_buf[0] = '\0';
    local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
    local_100.description._M_string_length = 0;
    local_100.description.field_2._M_local_buf[0] = '\0';
    local_100.current_value._M_dataplus._M_p = (pointer)&local_100.current_value.field_2;
    local_100.current_value._M_string_length = 0;
    local_100.current_value.field_2._M_local_buf[0] = '\0';
    local_100.default_value._M_dataplus._M_p = (pointer)&local_100.default_value.field_2;
    local_100.default_value._M_string_length = 0;
    local_100.default_value.field_2._M_local_buf[0] = '\0';
    local_100.filename._M_string_length = 0;
    local_100.filename.field_2._M_local_buf[0] = '\0';
    local_100.filename._M_dataplus._M_p = (pointer)&local_100.filename.field_2;
    anon_unknown_1::CommandLineFlag::FillCommandLineFlagInfo
              ((CommandLineFlag *)p_Var2[1]._M_parent,&local_100);
    std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::
    push_back(OUTPUT,&local_100);
    CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
  }
  gflags_mutex_namespace::Mutex::Unlock(&pFVar1->lock_);
  std::
  __sort<__gnu_cxx::__normal_iterator<google::CommandLineFlagInfo*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::FilenameFlagnameCmp>>
            ((OUTPUT->
             super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (OUTPUT->
             super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void GetAllFlags(vector<CommandLineFlagInfo>* OUTPUT) {
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  registry->Lock();
  for (FlagRegistry::FlagConstIterator i = registry->flags_.begin();
       i != registry->flags_.end(); ++i) {
    CommandLineFlagInfo fi;
    i->second->FillCommandLineFlagInfo(&fi);
    OUTPUT->push_back(fi);
  }
  registry->Unlock();
  // Now sort the flags, first by filename they occur in, then alphabetically
  sort(OUTPUT->begin(), OUTPUT->end(), FilenameFlagnameCmp());
}